

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O0

void __thiscall util_tests::test_FormatParagraph::test_method(test_FormatParagraph *this)

{
  string_view in;
  string_view in_00;
  string_view in_01;
  string_view in_02;
  string_view in_03;
  string_view in_04;
  string_view in_05;
  string_view in_06;
  string_view in_07;
  string_view in_08;
  string_view in_09;
  string_view in_10;
  string_view in_11;
  string_view in_12;
  string_view in_13;
  string_view in_14;
  bool bVar1;
  long in_FS_OFFSET;
  char *in_stack_fffffffffffff528;
  char *in_stack_fffffffffffff530;
  char *in_stack_fffffffffffff538;
  char *in_stack_fffffffffffff540;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffff548;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  const_string *in_stack_fffffffffffff550;
  const_string *msg;
  size_t in_stack_fffffffffffff558;
  undefined1 *line_num;
  const_string *in_stack_fffffffffffff560;
  char *file;
  unit_test_log_t *in_stack_fffffffffffff568;
  unit_test_log_t *this_01;
  size_t in_stack_fffffffffffff618;
  undefined1 *indent;
  size_t in_stack_fffffffffffff620;
  undefined1 *width;
  size_t in_stack_fffffffffffff638;
  basic_string_view<char,_std::char_traits<char>_> *pbVar2;
  char *in_stack_fffffffffffff640;
  char *pcVar3;
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [32];
  undefined1 local_7c8 [16];
  const_string local_7b8 [2];
  undefined1 local_798 [16];
  undefined1 local_788 [80];
  undefined1 local_738 [16];
  undefined1 local_728 [80];
  undefined1 local_6d8 [16];
  undefined1 local_6c8 [80];
  undefined1 local_678 [16];
  undefined1 local_668 [80];
  undefined1 local_618 [16];
  undefined1 local_608 [32];
  undefined1 local_5e8 [16];
  undefined1 local_5d8 [32];
  undefined1 local_5b8 [16];
  undefined1 local_5a8 [48];
  char local_578 [32];
  undefined1 local_558 [16];
  undefined1 local_548 [80];
  undefined1 local_4f8 [16];
  undefined1 local_4e8 [80];
  undefined1 local_498 [16];
  undefined1 local_488 [80];
  undefined1 local_438 [16];
  undefined1 local_428 [80];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [80];
  undefined1 local_378 [16];
  undefined1 local_368 [80];
  undefined1 local_318 [16];
  undefined1 local_308 [80];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [80];
  undefined1 local_258 [16];
  undefined1 local_248 [64];
  undefined1 local_208 [32];
  undefined1 local_1e8 [32];
  undefined1 local_1c8 [32];
  undefined1 local_1a8 [32];
  undefined1 local_188 [32];
  undefined1 local_168 [32];
  undefined1 local_148 [32];
  undefined1 local_128 [32];
  undefined1 local_108 [32];
  undefined1 local_e8 [32];
  undefined1 local_c8 [32];
  undefined1 local_a8 [32];
  undefined1 local_88 [32];
  undefined1 local_68 [32];
  undefined1 local_48 [32];
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,in_stack_fffffffffffff530,
               (unsigned_long)in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff528);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff568,in_stack_fffffffffffff560,in_stack_fffffffffffff558,
               in_stack_fffffffffffff550);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff530,(char (*) [1])in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,in_stack_fffffffffffff530,
               (unsigned_long)in_stack_fffffffffffff528);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff548,in_stack_fffffffffffff540);
    in._M_str = in_stack_fffffffffffff640;
    in._M_len = in_stack_fffffffffffff638;
    FormatParagraph_abi_cxx11_(in,in_stack_fffffffffffff620,in_stack_fffffffffffff618);
    in_stack_fffffffffffff538 = "\"\"";
    in_stack_fffffffffffff530 = "";
    in_stack_fffffffffffff528 = "FormatParagraph(\"\", 79, 0)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
              (local_248,local_258,0x3f4,1,2,local_28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff528);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff528);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,in_stack_fffffffffffff530,
               (unsigned_long)in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff528);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff568,in_stack_fffffffffffff560,in_stack_fffffffffffff558,
               in_stack_fffffffffffff550);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff530,(char (*) [1])in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,in_stack_fffffffffffff530,
               (unsigned_long)in_stack_fffffffffffff528);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff548,in_stack_fffffffffffff540);
    in_00._M_str = in_stack_fffffffffffff640;
    in_00._M_len = in_stack_fffffffffffff638;
    FormatParagraph_abi_cxx11_(in_00,in_stack_fffffffffffff620,in_stack_fffffffffffff618);
    in_stack_fffffffffffff538 = "\"test\"";
    in_stack_fffffffffffff530 = "test";
    in_stack_fffffffffffff528 = "FormatParagraph(\"test\", 79, 0)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
              (local_2a8,local_2b8,0x3f5,1,2,local_48);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff528);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff528);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,in_stack_fffffffffffff530,
               (unsigned_long)in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff528);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff568,in_stack_fffffffffffff560,in_stack_fffffffffffff558,
               in_stack_fffffffffffff550);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff530,(char (*) [1])in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,in_stack_fffffffffffff530,
               (unsigned_long)in_stack_fffffffffffff528);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff548,in_stack_fffffffffffff540);
    in_01._M_str = in_stack_fffffffffffff640;
    in_01._M_len = in_stack_fffffffffffff638;
    FormatParagraph_abi_cxx11_(in_01,in_stack_fffffffffffff620,in_stack_fffffffffffff618);
    in_stack_fffffffffffff538 = "\" test\"";
    in_stack_fffffffffffff530 = " test";
    in_stack_fffffffffffff528 = "FormatParagraph(\" test\", 79, 0)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[6]>
              (local_308,local_318,0x3f6,1,2,local_68);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff528);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff528);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,in_stack_fffffffffffff530,
               (unsigned_long)in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff528);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff568,in_stack_fffffffffffff560,in_stack_fffffffffffff558,
               in_stack_fffffffffffff550);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff530,(char (*) [1])in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,in_stack_fffffffffffff530,
               (unsigned_long)in_stack_fffffffffffff528);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff548,in_stack_fffffffffffff540);
    in_02._M_str = in_stack_fffffffffffff640;
    in_02._M_len = in_stack_fffffffffffff638;
    FormatParagraph_abi_cxx11_(in_02,in_stack_fffffffffffff620,in_stack_fffffffffffff618);
    in_stack_fffffffffffff538 = "\"test test\"";
    in_stack_fffffffffffff530 = "test test";
    in_stack_fffffffffffff528 = "FormatParagraph(\"test test\", 79, 0)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[10]>
              (local_368,local_378,0x3f7,1,2,local_88);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff528);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff528);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,in_stack_fffffffffffff530,
               (unsigned_long)in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff528);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff568,in_stack_fffffffffffff560,in_stack_fffffffffffff558,
               in_stack_fffffffffffff550);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff530,(char (*) [1])in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,in_stack_fffffffffffff530,
               (unsigned_long)in_stack_fffffffffffff528);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff548,in_stack_fffffffffffff540);
    in_03._M_str = in_stack_fffffffffffff640;
    in_03._M_len = in_stack_fffffffffffff638;
    FormatParagraph_abi_cxx11_(in_03,in_stack_fffffffffffff620,in_stack_fffffffffffff618);
    in_stack_fffffffffffff538 = "\"test\\ntest\"";
    in_stack_fffffffffffff530 = "test\ntest";
    in_stack_fffffffffffff528 = "FormatParagraph(\"test test\", 4, 0)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[10]>
              (local_3c8,local_3d8,0x3f8,1,2,local_a8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff528);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff528);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,in_stack_fffffffffffff530,
               (unsigned_long)in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff528);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff568,in_stack_fffffffffffff560,in_stack_fffffffffffff558,
               in_stack_fffffffffffff550);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff530,(char (*) [1])in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,in_stack_fffffffffffff530,
               (unsigned_long)in_stack_fffffffffffff528);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff548,in_stack_fffffffffffff540);
    in_04._M_str = in_stack_fffffffffffff640;
    in_04._M_len = in_stack_fffffffffffff638;
    FormatParagraph_abi_cxx11_(in_04,in_stack_fffffffffffff620,in_stack_fffffffffffff618);
    in_stack_fffffffffffff538 = "\"testerde\\ntest\"";
    in_stack_fffffffffffff530 = "testerde\ntest";
    in_stack_fffffffffffff528 = "FormatParagraph(\"testerde test\", 4, 0)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[14]>
              (local_428,local_438,0x3f9,1,2,local_c8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff528);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff528);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,in_stack_fffffffffffff530,
               (unsigned_long)in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff528);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff568,in_stack_fffffffffffff560,in_stack_fffffffffffff558,
               in_stack_fffffffffffff550);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff530,(char (*) [1])in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,in_stack_fffffffffffff530,
               (unsigned_long)in_stack_fffffffffffff528);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff548,in_stack_fffffffffffff540);
    in_05._M_str = in_stack_fffffffffffff640;
    in_05._M_len = in_stack_fffffffffffff638;
    FormatParagraph_abi_cxx11_(in_05,in_stack_fffffffffffff620,in_stack_fffffffffffff618);
    in_stack_fffffffffffff538 = "\"test\\n    test\"";
    in_stack_fffffffffffff530 = "test\n    test";
    in_stack_fffffffffffff528 = "FormatParagraph(\"test test\", 4, 4)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[14]>
              (local_488,local_498,0x3fa,1,2,local_e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff528);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff528);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,in_stack_fffffffffffff530,
               (unsigned_long)in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff528);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff568,in_stack_fffffffffffff560,in_stack_fffffffffffff558,
               in_stack_fffffffffffff550);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff530,(char (*) [1])in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,in_stack_fffffffffffff530,
               (unsigned_long)in_stack_fffffffffffff528);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff548,in_stack_fffffffffffff540);
    in_06._M_str = in_stack_fffffffffffff640;
    in_06._M_len = in_stack_fffffffffffff638;
    FormatParagraph_abi_cxx11_(in_06,in_stack_fffffffffffff620,in_stack_fffffffffffff618);
    in_stack_fffffffffffff538 = "\"test\\n    test\\nabc\"";
    in_stack_fffffffffffff530 = "test\n    test\nabc";
    in_stack_fffffffffffff528 = "FormatParagraph(\"test test\\nabc\", 4, 4)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[18]>
              (local_4e8,local_4f8,0x3fd,1,2,local_108);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff528);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff528);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,in_stack_fffffffffffff530,
               (unsigned_long)in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff528);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff568,in_stack_fffffffffffff560,in_stack_fffffffffffff558,
               in_stack_fffffffffffff550);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff530,(char (*) [1])in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,in_stack_fffffffffffff530,
               (unsigned_long)in_stack_fffffffffffff528);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff548,in_stack_fffffffffffff540);
    in_07._M_str = in_stack_fffffffffffff640;
    in_07._M_len = in_stack_fffffffffffff638;
    FormatParagraph_abi_cxx11_(in_07,in_stack_fffffffffffff620,in_stack_fffffffffffff618);
    in_stack_fffffffffffff538 =
         "\"This_is_a_very_long_test_string_without_any_spaces_so_it_should_just_get_returned_as_is_despite_the_length\\nuntil it gets here\""
    ;
    in_stack_fffffffffffff530 =
         "This_is_a_very_long_test_string_without_any_spaces_so_it_should_just_get_returned_as_is_despite_the_length\nuntil it gets here"
    ;
    in_stack_fffffffffffff528 =
         "FormatParagraph(\"This_is_a_very_long_test_string_without_any_spaces_so_it_should_just_get_returned_as_is_despite_the_length until it gets here\", 79)"
    ;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[126]>
              (local_548,local_558,0x3ff,1,2,local_128);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff528);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff528);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    pcVar3 = local_578;
    pbVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,in_stack_fffffffffffff530,
               (unsigned_long)in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff528);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff568,in_stack_fffffffffffff560,in_stack_fffffffffffff558,
               in_stack_fffffffffffff550);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff530,(char (*) [1])in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,in_stack_fffffffffffff530,
               (unsigned_long)in_stack_fffffffffffff528);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff548,in_stack_fffffffffffff540);
    in_08._M_str = pcVar3;
    in_08._M_len = (size_t)pbVar2;
    FormatParagraph_abi_cxx11_(in_08,in_stack_fffffffffffff620,in_stack_fffffffffffff618);
    in_stack_fffffffffffff538 =
         "\"a b c d e f g h i j k l m n o p q r s t u v w x y z 1 2 3 4 5 6 7 8 9 a b c de\\nf g h i j k l m n o p\""
    ;
    in_stack_fffffffffffff530 =
         "a b c d e f g h i j k l m n o p q r s t u v w x y z 1 2 3 4 5 6 7 8 9 a b c de\nf g h i j k l m n o p"
    ;
    in_stack_fffffffffffff528 =
         "FormatParagraph(\"a b c d e f g h i j k l m n o p q r s t u v w x y z 1 2 3 4 5 6 7 8 9 a b c de f g h i j k l m n o p\", 79)"
    ;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[101]>
              (local_5a8,local_5b8,0x402,1,2,local_148);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff528);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff528);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    indent = local_5d8;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,in_stack_fffffffffffff530,
               (unsigned_long)in_stack_fffffffffffff528);
    width = local_5e8;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff528);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff568,in_stack_fffffffffffff560,in_stack_fffffffffffff558,
               in_stack_fffffffffffff550);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff530,(char (*) [1])in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,in_stack_fffffffffffff530,
               (unsigned_long)in_stack_fffffffffffff528);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff548,in_stack_fffffffffffff540);
    in_09._M_str = pcVar3;
    in_09._M_len = (size_t)pbVar2;
    FormatParagraph_abi_cxx11_(in_09,(size_t)width,(size_t)indent);
    in_stack_fffffffffffff538 =
         "\"x\\na b c d e f g h i j k l m n o p q r s t u v w x y z 1 2 3 4 5 6 7 8 9 a b c de\\nf g h i j k l m n o p\""
    ;
    in_stack_fffffffffffff530 =
         "x\na b c d e f g h i j k l m n o p q r s t u v w x y z 1 2 3 4 5 6 7 8 9 a b c de\nf g h i j k l m n o p"
    ;
    in_stack_fffffffffffff528 =
         "FormatParagraph(\"x\\na b c d e f g h i j k l m n o p q r s t u v w x y z 1 2 3 4 5 6 7 8 9 a b c de f g h i j k l m n o p\", 79)"
    ;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[103]>
              (local_608,local_618,0x403,1,2,local_168);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff528);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff528);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,in_stack_fffffffffffff530,
               (unsigned_long)in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff528);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff568,in_stack_fffffffffffff560,in_stack_fffffffffffff558,
               in_stack_fffffffffffff550);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff530,(char (*) [1])in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,in_stack_fffffffffffff530,
               (unsigned_long)in_stack_fffffffffffff528);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff548,in_stack_fffffffffffff540);
    in_10._M_str = pcVar3;
    in_10._M_len = (size_t)pbVar2;
    FormatParagraph_abi_cxx11_(in_10,(size_t)width,(size_t)indent);
    in_stack_fffffffffffff538 =
         "\"x\\na b c d e f g h i j k l m n o p q r s t u v w x y z 1 2 3 4 5 6 7 8 9 a b c de\\n    f g h i j k l m n o p q r s t u v w x y z 0 1 2 3 4 5 6 7 8 9 a b c d e fg\\n    h i j k\""
    ;
    in_stack_fffffffffffff530 =
         "x\na b c d e f g h i j k l m n o p q r s t u v w x y z 1 2 3 4 5 6 7 8 9 a b c de\n    f g h i j k l m n o p q r s t u v w x y z 0 1 2 3 4 5 6 7 8 9 a b c d e fg\n    h i j k"
    ;
    in_stack_fffffffffffff528 =
         "FormatParagraph(\"x\\na b c d e f g h i j k l m n o p q r s t u v w x y z 1 2 3 4 5 6 7 8 9 a b c de f g h i j k l m n o p q r s t u v w x y z 0 1 2 3 4 5 6 7 8 9 a b c d e fg h i j k\", 79, 4)"
    ;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[172]>
              (local_668,local_678,0x405,1,2,local_188);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff528);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff528);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,in_stack_fffffffffffff530,
               (unsigned_long)in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff528);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff568,in_stack_fffffffffffff560,in_stack_fffffffffffff558,
               in_stack_fffffffffffff550);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff530,(char (*) [1])in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,in_stack_fffffffffffff530,
               (unsigned_long)in_stack_fffffffffffff528);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff548,in_stack_fffffffffffff540);
    in_11._M_str = pcVar3;
    in_11._M_len = (size_t)pbVar2;
    FormatParagraph_abi_cxx11_(in_11,(size_t)width,(size_t)indent);
    in_stack_fffffffffffff538 =
         "\"This is a very long test string. This is a second sentence in the very long\\ntest string.\""
    ;
    in_stack_fffffffffffff530 =
         "This is a very long test string. This is a second sentence in the very long\ntest string."
    ;
    in_stack_fffffffffffff528 =
         "FormatParagraph(\"This is a very long test string. This is a second sentence in the very long test string.\", 79)"
    ;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[89]>
              (local_6c8,local_6d8,0x407,1,2,local_1a8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff528);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff528);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,in_stack_fffffffffffff530,
               (unsigned_long)in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff528);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff568,in_stack_fffffffffffff560,in_stack_fffffffffffff558,
               in_stack_fffffffffffff550);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff530,(char (*) [1])in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,in_stack_fffffffffffff530,
               (unsigned_long)in_stack_fffffffffffff528);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff548,in_stack_fffffffffffff540);
    in_12._M_str = pcVar3;
    in_12._M_len = (size_t)pbVar2;
    FormatParagraph_abi_cxx11_(in_12,(size_t)width,(size_t)indent);
    in_stack_fffffffffffff538 =
         "\"This is a very long test string.\\nThis is a second sentence in the very long test string. This is a third\\nsentence in the very long test string.\""
    ;
    in_stack_fffffffffffff530 =
         "This is a very long test string.\nThis is a second sentence in the very long test string. This is a third\nsentence in the very long test string."
    ;
    in_stack_fffffffffffff528 =
         "FormatParagraph(\"This is a very long test string.\\nThis is a second sentence in the very long test string. This is a third sentence in the very long test string.\", 79)"
    ;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[144]>
              (local_728,local_738,0x408,1,2,local_1c8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff528);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff528);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,in_stack_fffffffffffff530,
               (unsigned_long)in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff528);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff568,in_stack_fffffffffffff560,in_stack_fffffffffffff558,
               in_stack_fffffffffffff550);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff530,(char (*) [1])in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,in_stack_fffffffffffff530,
               (unsigned_long)in_stack_fffffffffffff528);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff548,in_stack_fffffffffffff540);
    in_13._M_str = pcVar3;
    in_13._M_len = (size_t)pbVar2;
    FormatParagraph_abi_cxx11_(in_13,(size_t)width,(size_t)indent);
    in_stack_fffffffffffff538 =
         "\"This is a very long test string.\\n\\nThis is a second sentence in the very long test string. This is a third\\nsentence in the very long test string.\""
    ;
    in_stack_fffffffffffff530 =
         "This is a very long test string.\n\nThis is a second sentence in the very long test string. This is a third\nsentence in the very long test string."
    ;
    in_stack_fffffffffffff528 =
         "FormatParagraph(\"This is a very long test string.\\n\\nThis is a second sentence in the very long test string. This is a third sentence in the very long test string.\", 79)"
    ;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[145]>
              (local_788,local_798,0x409,1,2,local_1e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff528);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff528);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    file = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    msg = local_7b8;
    this_01 = (unit_test_log_t *)0x63;
    this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,in_stack_fffffffffffff530,
               (unsigned_long)in_stack_fffffffffffff528);
    line_num = local_7c8;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff528);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_01,(const_string *)file,(size_t)line_num,msg);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff530,(char (*) [1])in_stack_fffffffffffff528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff538,in_stack_fffffffffffff530,
               (unsigned_long)in_stack_fffffffffffff528);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (this_00,in_stack_fffffffffffff540);
    in_14._M_str = pcVar3;
    in_14._M_len = (size_t)pbVar2;
    FormatParagraph_abi_cxx11_(in_14,(size_t)width,(size_t)indent);
    in_stack_fffffffffffff538 = "\"Testing that normal newlines do not get indented.\\nLike here.\""
    ;
    in_stack_fffffffffffff530 = "Testing that normal newlines do not get indented.\nLike here.";
    in_stack_fffffffffffff528 =
         "FormatParagraph(\"Testing that normal newlines do not get indented.\\nLike here.\", 79)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[61]>
              (local_7e8,local_7f8,0x40a,1,2,local_208);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff528);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff528);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_FormatParagraph)
{
    BOOST_CHECK_EQUAL(FormatParagraph("", 79, 0), "");
    BOOST_CHECK_EQUAL(FormatParagraph("test", 79, 0), "test");
    BOOST_CHECK_EQUAL(FormatParagraph(" test", 79, 0), " test");
    BOOST_CHECK_EQUAL(FormatParagraph("test test", 79, 0), "test test");
    BOOST_CHECK_EQUAL(FormatParagraph("test test", 4, 0), "test\ntest");
    BOOST_CHECK_EQUAL(FormatParagraph("testerde test", 4, 0), "testerde\ntest");
    BOOST_CHECK_EQUAL(FormatParagraph("test test", 4, 4), "test\n    test");

    // Make sure we don't indent a fully-new line following a too-long line ending
    BOOST_CHECK_EQUAL(FormatParagraph("test test\nabc", 4, 4), "test\n    test\nabc");

    BOOST_CHECK_EQUAL(FormatParagraph("This_is_a_very_long_test_string_without_any_spaces_so_it_should_just_get_returned_as_is_despite_the_length until it gets here", 79), "This_is_a_very_long_test_string_without_any_spaces_so_it_should_just_get_returned_as_is_despite_the_length\nuntil it gets here");

    // Test wrap length is exact
    BOOST_CHECK_EQUAL(FormatParagraph("a b c d e f g h i j k l m n o p q r s t u v w x y z 1 2 3 4 5 6 7 8 9 a b c de f g h i j k l m n o p", 79), "a b c d e f g h i j k l m n o p q r s t u v w x y z 1 2 3 4 5 6 7 8 9 a b c de\nf g h i j k l m n o p");
    BOOST_CHECK_EQUAL(FormatParagraph("x\na b c d e f g h i j k l m n o p q r s t u v w x y z 1 2 3 4 5 6 7 8 9 a b c de f g h i j k l m n o p", 79), "x\na b c d e f g h i j k l m n o p q r s t u v w x y z 1 2 3 4 5 6 7 8 9 a b c de\nf g h i j k l m n o p");
    // Indent should be included in length of lines
    BOOST_CHECK_EQUAL(FormatParagraph("x\na b c d e f g h i j k l m n o p q r s t u v w x y z 1 2 3 4 5 6 7 8 9 a b c de f g h i j k l m n o p q r s t u v w x y z 0 1 2 3 4 5 6 7 8 9 a b c d e fg h i j k", 79, 4), "x\na b c d e f g h i j k l m n o p q r s t u v w x y z 1 2 3 4 5 6 7 8 9 a b c de\n    f g h i j k l m n o p q r s t u v w x y z 0 1 2 3 4 5 6 7 8 9 a b c d e fg\n    h i j k");

    BOOST_CHECK_EQUAL(FormatParagraph("This is a very long test string. This is a second sentence in the very long test string.", 79), "This is a very long test string. This is a second sentence in the very long\ntest string.");
    BOOST_CHECK_EQUAL(FormatParagraph("This is a very long test string.\nThis is a second sentence in the very long test string. This is a third sentence in the very long test string.", 79), "This is a very long test string.\nThis is a second sentence in the very long test string. This is a third\nsentence in the very long test string.");
    BOOST_CHECK_EQUAL(FormatParagraph("This is a very long test string.\n\nThis is a second sentence in the very long test string. This is a third sentence in the very long test string.", 79), "This is a very long test string.\n\nThis is a second sentence in the very long test string. This is a third\nsentence in the very long test string.");
    BOOST_CHECK_EQUAL(FormatParagraph("Testing that normal newlines do not get indented.\nLike here.", 79), "Testing that normal newlines do not get indented.\nLike here.");
}